

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall
tinygltf::NormalTextureInfo::NormalTextureInfo(NormalTextureInfo *this,NormalTextureInfo *param_1)

{
  int iVar1;
  NormalTextureInfo *param_1_local;
  NormalTextureInfo *this_local;
  
  iVar1 = param_1->texCoord;
  this->index = param_1->index;
  this->texCoord = iVar1;
  this->scale = param_1->scale;
  Value::Value(&this->extras,&param_1->extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&param_1->extensions);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

NormalTextureInfo() = default;